

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_proxy_constructor(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  ushort uVar1;
  int iVar2;
  int64_t iVar3;
  int64_t iVar4;
  int *piVar5;
  int *piVar6;
  JSValueUnion JVar7;
  undefined8 *puVar8;
  ulong uVar9;
  JSRefCountHeader *p;
  undefined1 uVar10;
  JSValue v;
  JSValue JVar11;
  
  iVar3 = argv->tag;
  iVar4 = argv[1].tag;
  if ((int)iVar4 == -1 && (int)iVar3 == -1) {
    piVar5 = (int *)(argv->u).ptr;
    piVar6 = (int *)argv[1].u.ptr;
    v = JS_NewObjectProtoClass(ctx,(JSValue)(ZEXT816(2) << 0x40),0x29);
    JVar7 = v.u;
    if ((v.tag & 0xffffffffU) != 6) {
      puVar8 = (undefined8 *)js_malloc(ctx,0x28);
      if (puVar8 == (undefined8 *)0x0) {
        if ((0xfffffff4 < (uint)v.tag) &&
           (iVar2 = *JVar7.ptr, *(int *)JVar7.ptr = iVar2 + -1, iVar2 < 2)) {
          __JS_FreeValueRT(ctx->rt,v);
        }
        uVar9 = 0;
        v = (JSValue)(ZEXT816(6) << 0x40);
        goto LAB_0012e09e;
      }
      *piVar5 = *piVar5 + 1;
      *puVar8 = piVar5;
      puVar8[1] = iVar3;
      *piVar6 = *piVar6 + 1;
      puVar8[2] = piVar6;
      puVar8[3] = iVar4;
      uVar1 = *(ushort *)((long)piVar5 + 6);
      if (uVar1 == 0xd) {
        uVar10 = 1;
      }
      else if (uVar1 == 0x29) {
        uVar10 = *(undefined1 *)(*(long *)(piVar5 + 0xc) + 0x20);
      }
      else {
        uVar10 = ctx->rt->class_array[uVar1].call != (JSClassCall *)0x0;
      }
      *(undefined1 *)(puVar8 + 4) = uVar10;
      *(undefined1 *)((long)puVar8 + 0x21) = 0;
      if ((uint)v.tag == 0xffffffff) {
        *(undefined8 **)((long)JVar7.ptr + 0x30) = puVar8;
        *(byte *)((long)JVar7.ptr + 5) =
             *(byte *)((long)JVar7.ptr + 5) & 0xef | *(byte *)((long)piVar5 + 5) & 0x10;
      }
    }
    uVar9 = (ulong)JVar7.ptr & 0xffffffff00000000;
  }
  else {
    JS_ThrowTypeError(ctx,"not an object",this_val.tag);
    v = (JSValue)(ZEXT816(6) << 0x40);
    uVar9 = 0;
  }
LAB_0012e09e:
  JVar11.u.ptr = (void *)((ulong)v.u.ptr & 0xffffffff | uVar9);
  JVar11.tag = v.tag;
  return JVar11;
}

Assistant:

static JSValue js_proxy_constructor(JSContext *ctx, JSValueConst this_val,
                                    int argc, JSValueConst *argv)
{
    JSValueConst target, handler;
    JSValue obj;
    JSProxyData *s;

    target = argv[0];
    handler = argv[1];
    if (JS_VALUE_GET_TAG(target) != JS_TAG_OBJECT ||
        JS_VALUE_GET_TAG(handler) != JS_TAG_OBJECT)
        return JS_ThrowTypeErrorNotAnObject(ctx);

    obj = JS_NewObjectProtoClass(ctx, JS_NULL, JS_CLASS_PROXY);
    if (JS_IsException(obj))
        return obj;
    s = js_malloc(ctx, sizeof(JSProxyData));
    if (!s) {
        JS_FreeValue(ctx, obj);
        return JS_EXCEPTION;
    }
    s->target = JS_DupValue(ctx, target);
    s->handler = JS_DupValue(ctx, handler);
    s->is_func = JS_IsFunction(ctx, target);
    s->is_revoked = FALSE;
    JS_SetOpaque(obj, s);
    JS_SetConstructorBit(ctx, obj, JS_IsConstructor(ctx, target));
    return obj;
}